

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSpecsOf.hpp
# Opt level: O2

void __thiscall sciplot::LineSpecs::~LineSpecs(LineSpecs *this)

{
  ~LineSpecs(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

LineSpecsOf<DerivedSpecs>::LineSpecsOf()
{
}